

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::insert(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> *this
        ,size_t i)

{
  Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> SVar1;
  
  SVar1 = this[0x89];
  if (SVar1 == this[0x88]) {
    addStorage(this);
    SVar1 = this[0x89];
  }
  this[0x89] = *(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                 *)(*(long *)(this + 0x80) + (ulong)(byte)SVar1 * 0x28);
  this[i] = SVar1;
  return (Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)
         ((ulong)(byte)SVar1 * 0x28 + *(long *)(this + 0x80));
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }